

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O0

void compact_upto_overwrite_test(int opt)

{
  long lVar1;
  fdb_status fVar2;
  int iVar3;
  int iVar4;
  int in_EDI;
  int upto;
  uint64_t n_markers;
  fdb_commit_opt_t commit_opt;
  fdb_seqnum_t seqnum;
  fdb_snapshot_info_t *markers;
  fdb_doc *doc;
  fdb_iterator *fit;
  fdb_kvs_info kvs_info;
  fdb_status s;
  fdb_kvs_config kvs_config;
  fdb_config config;
  fdb_kvs_handle *snap;
  fdb_kvs_handle *db;
  fdb_file_handle *db_file;
  char valuestr2 [18];
  char valuestr [10];
  char keystr [8];
  char *value;
  char key [256];
  char cmd [256];
  int c;
  int idx;
  int r;
  int i;
  int value_len;
  int n;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  uint64_t *in_stack_00000bd8;
  fdb_snapshot_info_t **in_stack_00000be0;
  fdb_file_handle *in_stack_00000be8;
  undefined2 in_stack_fffffffffffffa78;
  undefined2 uVar5;
  undefined2 in_stack_fffffffffffffa7a;
  undefined2 uVar6;
  undefined4 in_stack_fffffffffffffa7c;
  uint in_stack_fffffffffffffa80;
  undefined4 in_stack_fffffffffffffa84;
  uint uVar7;
  uint in_stack_fffffffffffffa88;
  uint in_stack_fffffffffffffa8c;
  fdb_kvs_handle *pfVar8;
  char *value_00;
  undefined4 in_stack_fffffffffffffaa8;
  undefined4 in_stack_fffffffffffffab4;
  fdb_kvs_handle *in_stack_fffffffffffffab8;
  fdb_file_handle *local_540;
  undefined1 local_530 [32];
  fdb_doc **in_stack_fffffffffffffaf0;
  fdb_iterator *in_stack_fffffffffffffaf8;
  ulong local_438;
  fdb_kvs_info *in_stack_fffffffffffffbe0;
  fdb_kvs_handle *in_stack_fffffffffffffbe8;
  size_t *psVar9;
  fdb_iterator *local_410 [6];
  fdb_kvs_config *in_stack_fffffffffffffc20;
  undefined4 in_stack_fffffffffffffc28;
  undefined1 local_3b8 [8];
  undefined8 local_3b0;
  undefined1 local_3a0;
  undefined1 local_398;
  undefined1 local_397;
  undefined1 local_378;
  fdb_config *in_stack_fffffffffffffc98;
  char *in_stack_fffffffffffffca0;
  fdb_file_handle **in_stack_fffffffffffffca8;
  fdb_seqnum_t in_stack_fffffffffffffd20;
  fdb_kvs_handle **in_stack_fffffffffffffd28;
  fdb_kvs_handle *in_stack_fffffffffffffd30;
  fdb_kvs_handle *local_2c0;
  fdb_kvs_handle *local_2b8;
  char local_2a8 [22];
  char local_292 [10];
  char local_288 [8];
  char *local_280;
  char local_278 [256];
  char local_178 [264];
  uint local_70;
  uint local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  __time_t local_38;
  __suseconds_t local_30;
  timeval local_18;
  int local_4;
  
  local_4 = in_EDI;
  gettimeofday(&local_18,(__timezone_ptr_t)0x0);
  local_38 = local_18.tv_sec;
  local_30 = local_18.tv_usec;
  local_5c = 10;
  local_60 = 0x20;
  builtin_strncpy(local_288,"key%06d",8);
  builtin_strncpy(local_292,"value%08d",10);
  builtin_strncpy(local_2a8,"updated_value%08d",0x12);
  sprintf(local_178,"rm -rf  compact_test* > errorlog.txt");
  local_68 = system(local_178);
  memleak_start();
  local_280 = (char *)malloc((long)local_60);
  fdb_get_default_config();
  memcpy(local_3b8,local_530,0xf8);
  local_397 = 2;
  local_398 = 1;
  local_3a0 = 1;
  local_378 = 1;
  local_3b0 = 0;
  fdb_get_default_kvs_config();
  pfVar8 = in_stack_fffffffffffffab8;
  fVar2 = fdb_open(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xb30);
    compact_upto_overwrite_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xb30,"void compact_upto_overwrite_test(int)");
    }
    fVar2 = FDB_RESULT_SUCCESS;
  }
  fVar2 = fdb_kvs_open(local_540,(fdb_kvs_handle **)pfVar8,
                       (char *)CONCAT44(fVar2,in_stack_fffffffffffffc28),in_stack_fffffffffffffc20);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xb32);
    compact_upto_overwrite_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xb32,"void compact_upto_overwrite_test(int)");
    }
  }
  for (local_64 = 0; local_64 < local_5c; local_64 = local_64 + 1) {
    local_6c = local_64 % (local_5c / 2);
    iVar4 = local_64;
    sprintf(local_278,local_288,(ulong)local_6c);
    memset(local_280,0x78,(long)local_60);
    builtin_strncpy(local_280 + (long)local_60 + -6,"<end>",6);
    iVar3 = local_64;
    if (local_64 < local_5c / 2) {
      sprintf(local_280,local_292,(ulong)local_6c);
    }
    else {
      sprintf(local_280,local_2a8,(ulong)local_6c);
    }
    value_00 = local_278;
    pfVar8 = local_2b8;
    strlen(local_278);
    fVar2 = fdb_set_kv(in_stack_fffffffffffffab8,(void *)CONCAT44(in_stack_fffffffffffffab4,iVar3),
                       CONCAT44(iVar4,in_stack_fffffffffffffaa8),value_00,(size_t)pfVar8);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0xb40);
      compact_upto_overwrite_test::__test_pass = 0;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0xb40,"void compact_upto_overwrite_test(int)");
      }
    }
    fVar2 = fdb_commit((fdb_file_handle *)
                       CONCAT44(in_stack_fffffffffffffa7c,
                                CONCAT22(in_stack_fffffffffffffa7a,in_stack_fffffffffffffa78)),'\0')
    ;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0xb4b);
      compact_upto_overwrite_test::__test_pass = 0;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0xb4b,"void compact_upto_overwrite_test(int)");
      }
    }
    fVar2 = fdb_get_kvs_info(in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0xb4d);
      compact_upto_overwrite_test::__test_pass = 0;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0xb4d,"void compact_upto_overwrite_test(int)");
      }
    }
  }
  fVar2 = fdb_get_all_snap_markers(in_stack_00000be8,in_stack_00000be0,in_stack_00000bd8);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xb51);
    compact_upto_overwrite_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xb51,"void compact_upto_overwrite_test(int)");
    }
  }
  iVar4 = (int)(local_438 >> 1);
  fVar2 = fdb_compact_upto((fdb_file_handle *)
                           CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                           (char *)CONCAT44(in_stack_fffffffffffffa7c,
                                            CONCAT22(in_stack_fffffffffffffa7a,
                                                     in_stack_fffffffffffffa78)),0x11451d);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xb55);
    compact_upto_overwrite_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xb55,"void compact_upto_overwrite_test(int)");
    }
  }
  local_64 = (int)local_438;
  while (local_64 = local_64 + -1, -1 < local_64) {
    lVar1 = *(long *)((&in_stack_fffffffffffffbe0->doc_count)[(long)local_64 * 3] + 8);
    fVar2 = fdb_snapshot_open(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                              in_stack_fffffffffffffd20);
    if (iVar4 < local_64) {
      if (fVar2 == FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xb60);
        compact_upto_overwrite_test::__test_pass = 0;
        if (fVar2 == FDB_RESULT_SUCCESS) {
          __assert_fail("s != FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xb60,"void compact_upto_overwrite_test(int)");
        }
      }
    }
    else {
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xb5d);
        compact_upto_overwrite_test::__test_pass = 0;
        if (fVar2 != FDB_RESULT_SUCCESS) {
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xb5d,"void compact_upto_overwrite_test(int)");
        }
      }
      uVar5 = 0;
      uVar6 = 0;
      fVar2 = fdb_iterator_init(local_2c0,local_410,(void *)0x0,0,(void *)0x0,0,0);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xb65);
        compact_upto_overwrite_test::__test_pass = 0;
        if (fVar2 != FDB_RESULT_SUCCESS) {
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xb65,"void compact_upto_overwrite_test(int)");
        }
      }
      local_70 = 0;
      do {
        psVar9 = (size_t *)0x0;
        fVar2 = fdb_iterator_get(in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
        if (fVar2 != FDB_RESULT_SUCCESS) break;
        local_6c = local_70;
        sprintf(local_278,local_288,(ulong)local_70);
        memset(local_280,0x78,(long)local_60);
        builtin_strncpy(local_280 + (long)local_60 + -6,"<end>",6);
        if ((ulong)(long)(int)local_70 < (ulong)(lVar1 - local_5c / 2)) {
          sprintf(local_280,local_2a8,(ulong)local_6c);
        }
        else {
          sprintf(local_280,local_292,(ulong)local_6c);
        }
        iVar3 = memcmp((void *)psVar9[4],local_278,*psVar9);
        if (iVar3 != 0) {
          fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_278,psVar9[4],
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xb74);
          compact_upto_overwrite_test::__test_pass = 0;
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xb74,"void compact_upto_overwrite_test(int)");
        }
        iVar3 = memcmp((void *)psVar9[8],local_280,psVar9[2]);
        if (iVar3 != 0) {
          fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_280,psVar9[8],
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xb75);
          compact_upto_overwrite_test::__test_pass = 0;
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xb75,"void compact_upto_overwrite_test(int)");
        }
        local_70 = local_70 + 1;
        fdb_doc_free((fdb_doc *)0x1149c2);
        fVar2 = fdb_iterator_next((fdb_iterator *)
                                  CONCAT44(in_stack_fffffffffffffa7c,CONCAT22(uVar6,uVar5)));
      } while (fVar2 == FDB_RESULT_SUCCESS);
      fVar2 = fdb_iterator_close((fdb_iterator *)
                                 CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xb7a);
        compact_upto_overwrite_test::__test_pass = 0;
        if (fVar2 != FDB_RESULT_SUCCESS) {
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xb7a,"void compact_upto_overwrite_test(int)");
        }
      }
      in_stack_fffffffffffffa8c = local_70;
      if (local_70 != local_5c / 2) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xb7b);
        compact_upto_overwrite_test::__test_pass = 0;
        in_stack_fffffffffffffa88 = local_70;
        if (local_70 != local_5c / 2) {
          __assert_fail("c == (n/2)",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xb7b,"void compact_upto_overwrite_test(int)");
        }
      }
      fVar2 = fdb_kvs_close((fdb_kvs_handle *)
                            CONCAT44(in_stack_fffffffffffffa7c,CONCAT22(uVar6,uVar5)));
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xb7e);
        compact_upto_overwrite_test::__test_pass = 0;
        if (fVar2 != FDB_RESULT_SUCCESS) {
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0xb7e,"void compact_upto_overwrite_test(int)");
        }
      }
    }
  }
  uVar5 = 0;
  uVar6 = 0;
  fVar2 = fdb_iterator_init(local_2b8,local_410,(void *)0x0,0,(void *)0x0,0,0);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xb83);
    compact_upto_overwrite_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xb83,"void compact_upto_overwrite_test(int)");
    }
  }
  local_70 = 0;
  do {
    psVar9 = (size_t *)0x0;
    fVar2 = fdb_iterator_get(in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
    if (fVar2 != FDB_RESULT_SUCCESS) break;
    local_6c = local_70;
    sprintf(local_278,local_288,(ulong)local_70);
    memset(local_280,0x78,(long)local_60);
    builtin_strncpy(local_280 + (long)local_60 + -6,"<end>",6);
    sprintf(local_280,local_2a8,(ulong)local_6c);
    iVar4 = memcmp((void *)psVar9[4],local_278,*psVar9);
    if (iVar4 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_278,psVar9[4],
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0xb8e);
      compact_upto_overwrite_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xb8e,"void compact_upto_overwrite_test(int)");
    }
    iVar4 = memcmp((void *)psVar9[8],local_280,psVar9[2]);
    if (iVar4 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_280,psVar9[8],
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0xb8f);
      compact_upto_overwrite_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xb8f,"void compact_upto_overwrite_test(int)");
    }
    local_70 = local_70 + 1;
    fdb_doc_free((fdb_doc *)0x114e14);
    fVar2 = fdb_iterator_next((fdb_iterator *)
                              CONCAT44(in_stack_fffffffffffffa7c,CONCAT22(uVar6,uVar5)));
  } while (fVar2 == FDB_RESULT_SUCCESS);
  fVar2 = fdb_iterator_close((fdb_iterator *)
                             CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xb94);
    compact_upto_overwrite_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xb94,"void compact_upto_overwrite_test(int)");
    }
  }
  uVar7 = local_70;
  if (local_70 != local_5c / 2) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xb95);
    compact_upto_overwrite_test::__test_pass = 0;
    in_stack_fffffffffffffa80 = local_70;
    if (local_70 != local_5c / 2) {
      __assert_fail("c == (n/2)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xb95,"void compact_upto_overwrite_test(int)");
    }
  }
  fVar2 = fdb_free_snap_markers
                    ((fdb_snapshot_info_t *)
                     CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
                     CONCAT44(uVar7,in_stack_fffffffffffffa80));
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xb98);
    compact_upto_overwrite_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xb98,"void compact_upto_overwrite_test(int)");
    }
  }
  free(local_280);
  fVar2 = fdb_close((fdb_file_handle *)CONCAT44(in_stack_fffffffffffffa7c,CONCAT22(uVar6,uVar5)));
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xb9b);
    compact_upto_overwrite_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xb9b,"void compact_upto_overwrite_test(int)");
    }
  }
  fVar2 = fdb_shutdown();
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xb9d);
    compact_upto_overwrite_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xb9d,"void compact_upto_overwrite_test(int)");
    }
  }
  memleak_end();
  sprintf(local_178,"compact upto overwrite test");
  if (local_4 == 0) {
    strcat(local_178," (HB+trie)");
  }
  else if (local_4 == 1) {
    strcat(local_178," (WAL)");
  }
  else if (local_4 == 2) {
    strcat(local_178," (mixed, HB+trie/WAL)");
  }
  else if (local_4 == 3) {
    strcat(local_178," (mixed, WAL/HB+trie)");
  }
  if (compact_upto_overwrite_test::__test_pass == 0) {
    fprintf(_stderr,"%s FAILED\n",local_178);
  }
  else {
    fprintf(_stderr,"%s PASSED\n",local_178);
  }
  return;
}

Assistant:

void compact_upto_overwrite_test(int opt)
{
    TEST_INIT();

    int n = 10, value_len=32;
    int i, r, idx, c;
    char cmd[256];
    char key[256], *value;
    char keystr[] = "key%06d";
    char valuestr[] = "value%08d";
    char valuestr2[] = "updated_value%08d";
    fdb_file_handle *db_file;
    fdb_kvs_handle *db, *snap;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_status s;
    fdb_kvs_info kvs_info;
    fdb_iterator *fit;
    fdb_doc *doc;
    fdb_snapshot_info_t *markers;
    fdb_seqnum_t seqnum;
    fdb_commit_opt_t commit_opt;
    uint64_t n_markers;

    sprintf(cmd, SHELL_DEL " compact_test* > errorlog.txt");
    r = system(cmd);
    (void)r;

    memleak_start();

    value = (char*)malloc(value_len);

    config = fdb_get_default_config();
    config.durability_opt = FDB_DRB_ASYNC;
    config.seqtree_opt = FDB_SEQTREE_USE;
    config.wal_flush_before_commit = true;
    config.multi_kv_instances = true;
    config.buffercache_size = 0;
    config.block_reusing_threshold = 0;

    commit_opt = (opt)?FDB_COMMIT_NORMAL:FDB_COMMIT_MANUAL_WAL_FLUSH;

    kvs_config = fdb_get_default_kvs_config();

    s = fdb_open(&db_file, "./compact_test", &config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_open(db_file, &db, "db", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // === write ===
    for (i=0;i<n;++i){
        idx = i % (n/2);
        sprintf(key, keystr, idx);
        memset(value, 'x', value_len);
        memcpy(value + value_len - 6, "<end>", 6);
        if (i < (n/2)) {
            sprintf(value, valuestr, idx);
        } else {
            sprintf(value, valuestr2, idx);
        }
        s = fdb_set_kv(db, key, strlen(key)+1, value, value_len);
        TEST_CHK(s == FDB_RESULT_SUCCESS);

        if (opt == 2) {
            // HB+trie, WAL, HB+trie, WAL...
            commit_opt = (i%2)?FDB_COMMIT_NORMAL:FDB_COMMIT_MANUAL_WAL_FLUSH;
        } else if (opt == 3) {
            // WAL, HB+trie, WAL, HB+trie...
            commit_opt = (i%2)?FDB_COMMIT_MANUAL_WAL_FLUSH:FDB_COMMIT_NORMAL;
        }

        s = fdb_commit(db_file, commit_opt);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        s = fdb_get_kvs_info(db, &kvs_info);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }

    s = fdb_get_all_snap_markers(db_file, &markers, &n_markers);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    int upto = n_markers/2;
    s = fdb_compact_upto(db_file, "./compact_test2", markers[upto].marker);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // iterating using snapshots with various seqnums
    for (i=n_markers-1; i>=0; --i) {
        seqnum = markers[i].kvs_markers->seqnum;

        s = fdb_snapshot_open(db, &snap, seqnum);
        if (i<=upto) {
            TEST_CHK(s == FDB_RESULT_SUCCESS);
        } else {
            // seqnum < (n/2) must fail
            TEST_CHK(s != FDB_RESULT_SUCCESS);
            continue;
        }

        s = fdb_iterator_init(snap, &fit, NULL, 0, NULL, 0, 0);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        c = 0;
        do {
            doc = NULL;
            s = fdb_iterator_get(fit, &doc);
            if (s != FDB_RESULT_SUCCESS) break;
            idx = c;
            sprintf(key, keystr, idx);
            memset(value, 'x', value_len);
            memcpy(value + value_len - 6, "<end>", 6);
            if ((fdb_seqnum_t)c >= seqnum-(n/2)) {
                sprintf(value, valuestr, idx);
            } else {
                sprintf(value, valuestr2, idx);
            }
            TEST_CMP(doc->key, key, doc->keylen);
            TEST_CMP(doc->body, value, doc->bodylen);
            c++;
            fdb_doc_free(doc);
        } while(fdb_iterator_next(fit) == FDB_RESULT_SUCCESS);
        s = fdb_iterator_close(fit);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CHK(c == (n/2));

        s = fdb_kvs_close(snap);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }

    // iterating using the original handle
    s = fdb_iterator_init(db, &fit, NULL, 0, NULL, 0, 0);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    c = 0;
    do {
        doc = NULL;
        s = fdb_iterator_get(fit, &doc);
        if (s != FDB_RESULT_SUCCESS) break;
        idx = c;
        sprintf(key, keystr, idx);
        memset(value, 'x', value_len);
        memcpy(value + value_len - 6, "<end>", 6);
        sprintf(value, valuestr2, idx);
        TEST_CMP(doc->key, key, doc->keylen);
        TEST_CMP(doc->body, value, doc->bodylen);
        c++;
        fdb_doc_free(doc);
    } while(fdb_iterator_next(fit) == FDB_RESULT_SUCCESS);
    s = fdb_iterator_close(fit);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    TEST_CHK(c == (n/2));

    s = fdb_free_snap_markers(markers, n_markers);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    free(value);
    s = fdb_close(db_file);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_shutdown();
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    memleak_end();

    sprintf(cmd, "compact upto overwrite test");
    if (opt == 0) {
        strcat(cmd, " (HB+trie)");
    } else if (opt == 1) {
        strcat(cmd, " (WAL)");
    } else if (opt == 2) {
        strcat(cmd, " (mixed, HB+trie/WAL)");
    } else if (opt == 3) {
        strcat(cmd, " (mixed, WAL/HB+trie)");
    }
    TEST_RESULT(cmd);
}